

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall
QMenuPrivate::ScrollerTearOffItem::paintEvent(ScrollerTearOffItem *this,QPaintEvent *e)

{
  Type type;
  int iVar1;
  QWidgetData *pQVar2;
  QWidget *pQVar3;
  QWidget *this_00;
  char cVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  QStyle *pQVar8;
  QMenuPrivate *pQVar9;
  Representation RVar10;
  long in_FS_OFFSET;
  QPainter p;
  undefined1 *local_50;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QWidget).data;
  local_48.x2.m_i = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
  local_48.y2.m_i = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  cVar4 = QRect::intersects((QRect *)(e + 0x10));
  if (cVar4 != '\0') {
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)&local_50,&(this->super_QWidget).super_QPaintDevice);
    pQVar9 = this->menuPrivate;
    pQVar3 = *(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10);
    type = this->scrollType;
    pQVar2 = (this->super_QWidget).data;
    iVar6 = (pQVar2->crect).x2.m_i;
    this_00 = *(QWidget **)&(pQVar9->super_QWidgetPrivate).field_0x8;
    iVar1 = (pQVar2->crect).x1.m_i;
    pQVar8 = QWidget::style(this_00);
    iVar5 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x1b,0,this_00);
    local_48.x1.m_i = 0;
    local_48.y1.m_i = 0;
    local_48.y2.m_i = iVar5 + -1;
    local_48.x2.m_i = iVar6 - iVar1;
    drawScroller(pQVar9,(QPainter *)&local_50,type,&local_48);
    if (this->scrollType == ScrollUp) {
      pQVar2 = (this->super_QWidget).data;
      RVar10.m_i = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
      pQVar8 = QWidget::style(pQVar3);
      iVar6 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x1f,0,pQVar3);
      local_48.x1.m_i = 0;
      local_48.y1.m_i = 0;
      local_48.y2.m_i = iVar6 + -1;
      local_48.x2.m_i = RVar10.m_i;
      pQVar9 = this->menuPrivate;
      if ((pQVar9->scroll != (QMenuScroller *)0x0) && ((pQVar9->scroll->scrollFlags & 1) != 0)) {
        pQVar3 = *(QWidget **)&(pQVar9->super_QWidgetPrivate).field_0x8;
        pQVar8 = QWidget::style(pQVar3);
        uVar7 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x1b,0,pQVar3);
        local_48._0_8_ = (ulong)uVar7 << 0x20;
        local_48.y2.m_i = iVar6 + -1 + uVar7;
        pQVar9 = this->menuPrivate;
      }
      drawTearOff(pQVar9,(QPainter *)&local_50,&local_48);
    }
    QPainter::~QPainter((QPainter *)&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::ScrollerTearOffItem::paintEvent(QPaintEvent *e)
{
    if (!e->rect().intersects(rect()))
        return;

    QPainter p(this);
    QWidget *parent = parentWidget();

    //paint scroll up / down arrows
    menuPrivate->drawScroller(&p, scrollType, QRect(0, 0, width(), menuPrivate->scrollerHeight()));
    //paint the tear off
    if (scrollType == QMenuPrivate::ScrollerTearOffItem::ScrollUp) {
        QRect rect(0, 0, width(), parent->style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, parent));
        if (menuPrivate->scroll && menuPrivate->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
            rect.translate(0, menuPrivate->scrollerHeight());
        menuPrivate->drawTearOff(&p, rect);
    }
}